

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O0

void __thiscall
FactorTimer::initialiseFactorClocks(FactorTimer *this,HighsTimerClock *factor_timer_clock)

{
  HighsInt HVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar6;
  long in_RSI;
  vector<int,_std::allocator<int>_> *clock;
  HighsTimer *timer_pointer;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RSI + 8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,1);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,2);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,3);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,4);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,5);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,6);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,7);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,8);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,9);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,10);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xb);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xc);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xd);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xe);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xf);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x10);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x11);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x12);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x13);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x14);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x15);
  *pvVar6 = HVar1;
  HVar2 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x16);
  *pvVar6 = HVar2;
  HVar3 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x17);
  *pvVar6 = HVar3;
  HVar4 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffffa4,HVar3),
                     (char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x18);
  *pvVar6 = HVar4;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x19);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1a);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1b);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1c);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1d);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1e);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1f);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x20);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x21);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x22);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x23);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x24);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x25);
  *pvVar6 = HVar5;
  HVar1 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x26);
  *pvVar6 = HVar1;
  return;
}

Assistant:

void initialiseFactorClocks(HighsTimerClock& factor_timer_clock) {
    HighsTimer* timer_pointer = factor_timer_clock.timer_pointer_;
    std::vector<HighsInt>& clock = factor_timer_clock.clock_;
    clock.resize(FactorNumClock);
    clock[FactorInvert] = timer_pointer->clock_def("INVERT");
    clock[FactorInvertSimple] = timer_pointer->clock_def("INVERT Simple");
    clock[FactorInvertKernel] = timer_pointer->clock_def("INVERT Kernel");
    clock[FactorInvertDeficient] = timer_pointer->clock_def("INVERT Deficient");
    clock[FactorInvertFinish] = timer_pointer->clock_def("INVERT Finish");
    clock[FactorFtran] = timer_pointer->clock_def("FTRAN");
    clock[FactorFtranLower] = timer_pointer->clock_def("FTRAN Lower");
    clock[FactorFtranLowerAPF] = timer_pointer->clock_def("FTRAN Lower APF");
    clock[FactorFtranLowerDse] = timer_pointer->clock_def("FTRAN Lower Dse");
    clock[FactorFtranLowerSps] = timer_pointer->clock_def("FTRAN Lower Sps");
    clock[FactorFtranLowerHyper] =
        timer_pointer->clock_def("FTRAN Lower Hyper");
    clock[FactorFtranUpper] = timer_pointer->clock_def("FTRAN Upper");
    clock[FactorFtranUpperFT] = timer_pointer->clock_def("FTRAN Upper FT");
    clock[FactorFtranUpperMPF] = timer_pointer->clock_def("FTRAN Upper MPF");
    clock[FactorFtranUpperDse] = timer_pointer->clock_def("FTRAN Upper Dse");
    clock[FactorFtranUpperSps0] = timer_pointer->clock_def("FTRAN Upper Sps0");
    clock[FactorFtranUpperSps1] = timer_pointer->clock_def("FTRAN Upper Sps1");
    clock[FactorFtranUpperSps2] = timer_pointer->clock_def("FTRAN Upper Sps2");
    clock[FactorFtranUpperHyper0] =
        timer_pointer->clock_def("FTRAN Upper Hyper0");
    clock[FactorFtranUpperHyper1] =
        timer_pointer->clock_def("FTRAN Upper Hyper1");
    clock[FactorFtranUpperHyper2] =
        timer_pointer->clock_def("FTRAN Upper Hyper2");
    clock[FactorFtranUpperHyper3] =
        timer_pointer->clock_def("FTRAN Upper Hyper3");
    clock[FactorFtranUpperHyper4] =
        timer_pointer->clock_def("FTRAN Upper Hyper4");
    clock[FactorFtranUpperHyper5] =
        timer_pointer->clock_def("FTRAN Upper Hyper5");
    clock[FactorFtranUpperPF] = timer_pointer->clock_def("FTRAN Upper PF");
    clock[FactorBtran] = timer_pointer->clock_def("BTRAN");
    clock[FactorBtranLower] = timer_pointer->clock_def("BTRAN Lower");
    clock[FactorBtranLowerDse] = timer_pointer->clock_def("BTRAN Lower Dse");
    clock[FactorBtranLowerSps] = timer_pointer->clock_def("BTRAN Lower Sps");
    clock[FactorBtranLowerHyper] =
        timer_pointer->clock_def("BTRAN Lower Hyper");
    clock[FactorBtranLowerAPF] = timer_pointer->clock_def("BTRAN Lower APF");
    clock[FactorBtranUpper] = timer_pointer->clock_def("BTRAN Upper");
    clock[FactorBtranUpperPF] = timer_pointer->clock_def("BTRAN Upper PF");
    clock[FactorBtranUpperDse] = timer_pointer->clock_def("BTRAN Upper Dse");
    clock[FactorBtranUpperSps] = timer_pointer->clock_def("BTRAN Upper Sps");
    clock[FactorBtranUpperHyper] =
        timer_pointer->clock_def("BTRAN Upper Hyper");
    clock[FactorBtranUpperFT] = timer_pointer->clock_def("BTRAN Upper FT");
    clock[FactorBtranUpperMPF] = timer_pointer->clock_def("BTRAN Upper MPS");
    clock[FactorReinvert] = timer_pointer->clock_def("ReINVERT");
  }